

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O0

void m68k_op_bfset_32_ai(void)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint local_2c;
  uint ea;
  uint mask_byte;
  uint data_byte;
  uint mask_long;
  uint data_long;
  uint mask_base;
  uint width;
  sint offset;
  uint word2;
  
  if ((m68ki_cpu.cpu_type & 0x3f8) == 0) {
    m68ki_exception_illegal();
  }
  else {
    data_long = m68ki_read_imm_16();
    mask_base = data_long >> 6 & 0x1f;
    if ((data_long & 0x800) != 0) {
      mask_base = m68ki_cpu.dar[(int)(data_long >> 6 & 7)];
    }
    if ((data_long & 0x20) != 0) {
      data_long = m68ki_cpu.dar[data_long & 7];
    }
    local_2c = (int)mask_base / 8 + m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
    mask_base = (int)mask_base % 8;
    if ((int)mask_base < 0) {
      mask_base = mask_base + 8;
      local_2c = local_2c - 1;
    }
    iVar1 = (data_long - 1 & 0x1f) + 1;
    uVar2 = -1 << (0x20U - (char)iVar1 & 0x1f);
    uVar3 = uVar2 >> ((byte)mask_base & 0x1f);
    uVar4 = m68ki_read_32_fc(local_2c,m68ki_cpu.s_flag | m68ki_address_space);
    m68ki_cpu.n_flag = (uVar4 << ((byte)mask_base & 0x1f)) >> 0x18;
    m68ki_cpu.not_z_flag = uVar4 & uVar3;
    m68ki_cpu.v_flag = 0;
    m68ki_cpu.c_flag = 0;
    m68ki_write_32_fc(local_2c,m68ki_cpu.s_flag | 1,uVar4 | uVar3);
    if (0x20 < iVar1 + mask_base) {
      uVar2 = uVar2 & 0xff;
      uVar4 = m68ki_read_8_fc(local_2c + 4,m68ki_cpu.s_flag | m68ki_address_space);
      m68ki_cpu.not_z_flag = uVar4 & uVar2 | m68ki_cpu.not_z_flag;
      m68ki_write_8_fc(local_2c + 4,m68ki_cpu.s_flag | 1,uVar4 | uVar2);
    }
  }
  return;
}

Assistant:

static void m68k_op_bfset_32_ai(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		uint word2 = OPER_I_16();
		sint offset = (word2>>6)&31;
		uint width = word2;
		uint mask_base;
		uint data_long;
		uint mask_long;
		uint data_byte = 0;
		uint mask_byte = 0;
		uint ea = EA_AY_AI_8();


		if(BIT_B(word2))
			offset = MAKE_INT_32(REG_D[offset&7]);
		if(BIT_5(word2))
			width = REG_D[width&7];

		/* Offset is signed so we have to use ugly math =( */
		ea += offset / 8;
		offset %= 8;
		if(offset < 0)
		{
			offset += 8;
			ea--;
		}
		width = ((width-1) & 31) + 1;


		mask_base = MASK_OUT_ABOVE_32(0xffffffff << (32 - width));
		mask_long = mask_base >> offset;

		data_long = m68ki_read_32(ea);
		FLAG_N = NFLAG_32(data_long << offset);
		FLAG_Z = data_long & mask_long;
		FLAG_V = VFLAG_CLEAR;
		FLAG_C = CFLAG_CLEAR;

		m68ki_write_32(ea, data_long | mask_long);

		if((width + offset) > 32)
		{
			mask_byte = MASK_OUT_ABOVE_8(mask_base);
			data_byte = m68ki_read_8(ea+4);
			FLAG_Z |= (data_byte & mask_byte);
			m68ki_write_8(ea+4, data_byte | mask_byte);
		}
		return;
	}
	m68ki_exception_illegal();
}